

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::prepareFragmentShader
          (GeometryShaderMaxOutputComponentsSinglePointTest *this,string *out_shader_code)

{
  ostream *poVar1;
  int i;
  int iVar2;
  int i_1;
  stringstream stream;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(&local_1a8,"${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n\n");
  std::operator<<(&local_1a8,"// definitions of gs_fs_out_ varyings go here\n");
  for (iVar2 = 0; iVar2 < this->m_n_available_vectors; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"flat in ivec4");
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,";\n");
  }
  std::operator<<(&local_1a8,
                  "\nlayout(location = 0) out int fs_out;\n\nvoid main()\n{\n    int sum = 0;\n\n    // sum calculation go here\n"
                 );
  for (iVar2 = 0; iVar2 < this->m_n_available_vectors; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"    ");
    poVar1 = std::operator<<(poVar1,"sum += ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1,".x + ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1,".y + ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1,".z + ");
    poVar1 = std::operator<<(poVar1,"gs_fs_out_");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,".w;\n");
  }
  std::operator<<(&local_1a8,"\n    fs_out = sum;\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_shader_code,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void GeometryShaderMaxOutputComponentsSinglePointTest::prepareFragmentShader(std::string& out_shader_code) const
{
	std::stringstream stream;

	stream << m_fragment_shader_code_preamble;
	stream << m_common_shader_code_gs_fs_out_definitions;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << m_fragment_shader_code_flat_in_ivec4 << " " << m_common_shader_code_gs_fs_out << i << ";\n";
	}

	stream << m_fragment_shader_code_body_begin;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << "    " << m_fragment_shader_code_sum << m_common_shader_code_gs_fs_out << i << ".x + "
			   << m_common_shader_code_gs_fs_out << i << ".y + " << m_common_shader_code_gs_fs_out << i << ".z + "
			   << m_common_shader_code_gs_fs_out << i << ".w;\n";
	}

	stream << m_fragment_shader_code_body_end;

	out_shader_code = stream.str();
}